

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O1

bool __thiscall
sptk::SymmetricMatrix::GetDiagonal
          (SymmetricMatrix *this,vector<double,_std::allocator<double>_> *diagonal_elements)

{
  int iVar1;
  pointer ppdVar2;
  pointer pdVar3;
  long lVar4;
  
  if (diagonal_elements != (vector<double,_std::allocator<double>_> *)0x0) {
    if ((long)(diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)this->num_dimension_) {
      std::vector<double,_std::allocator<double>_>::resize
                (diagonal_elements,(long)this->num_dimension_);
    }
    iVar1 = this->num_dimension_;
    if (0 < (long)iVar1) {
      ppdVar2 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar3 = (diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = 0;
      do {
        pdVar3[lVar4] = ppdVar2[lVar4][lVar4];
        lVar4 = lVar4 + 1;
      } while (iVar1 != lVar4);
    }
  }
  return diagonal_elements != (vector<double,_std::allocator<double>_> *)0x0;
}

Assistant:

bool SymmetricMatrix::GetDiagonal(
    std::vector<double>* diagonal_elements) const {
  if (NULL == diagonal_elements) {
    return false;
  }
  if (diagonal_elements->size() != static_cast<std::size_t>(num_dimension_)) {
    diagonal_elements->resize(num_dimension_);
  }
  for (int i(0); i < num_dimension_; ++i) {
    (*diagonal_elements)[i] = index_[i][i];
  }
  return true;
}